

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtConvexHullShape * __thiscall
cbtCollisionWorldImporter::createConvexHullShape(cbtCollisionWorldImporter *this)

{
  cbtConvexHullShape *this_00;
  cbtConvexHullShape *local_18;
  
  this_00 = (cbtConvexHullShape *)cbtConvexHullShape::operator_new(0x98);
  cbtConvexHullShape::cbtConvexHullShape(this_00,(cbtScalar *)0x0,0,0x10);
  local_18 = this_00;
  cbtAlignedObjectArray<cbtCollisionShape_*>::push_back
            (&this->m_allocatedCollisionShapes,(cbtCollisionShape **)&local_18);
  return this_00;
}

Assistant:

cbtConvexHullShape* cbtCollisionWorldImporter::createConvexHullShape()
{
	cbtConvexHullShape* shape = new cbtConvexHullShape();
	m_allocatedCollisionShapes.push_back(shape);
	return shape;
}